

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteKey
          (WalletBatch *this,CPubKey *vchPubKey,CPrivKey *vchPrivKey,CKeyMetadata *keyMeta)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchKey;
  uint256 local_e8;
  pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  bVar1 = WriteKeyMetadata(this,keyMeta,vchPubKey,false);
  if (bVar1) {
    vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((vchPubKey->vch[0] & 0xfe) == 2) {
      lVar4 = 0x21;
    }
    else {
      bVar2 = vchPubKey->vch[0] - 4;
      if (bVar2 < 4) {
        lVar4 = *(long *)(&DAT_003f6198 + (ulong)bVar2 * 8);
      }
      else {
        lVar4 = 0;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&vchKey,(size_type)
                       ((vchPrivKey->
                        super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl
                        .super__Vector_impl_data._M_finish +
                       (lVar4 - (long)(vchPrivKey->
                                      super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start)));
    if ((vchPubKey->vch[0] & 0xfe) == 2) {
      lVar4 = 0x21;
    }
    else {
      bVar2 = vchPubKey->vch[0] - 4;
      if (bVar2 < 4) {
        lVar4 = *(long *)(&DAT_003f6198 + (ulong)bVar2 * 8);
      }
      else {
        lVar4 = 0;
      }
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchKey,
               (const_iterator)
               vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,vchPubKey->vch,vchPubKey->vch + lVar4);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchKey,
               (const_iterator)
               vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                )(vchPrivKey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                )(vchPrivKey->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string
              ((string *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               DBKeys::KEY_abi_cxx11_);
    memcpy(&local_90.second,vchPubKey,0x41);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_e8,&vchKey);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector(&local_c8.first,vchPrivKey)
    ;
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x10];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x11];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x12];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x13];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x14];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x15];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x16];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x17];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x18];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x19];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1a];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1b];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1c];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1d];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[1] =
         local_e8.super_base_blob<256U>.m_data._M_elems[1];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[2] =
         local_e8.super_base_blob<256U>.m_data._M_elems[2];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[3] =
         local_e8.super_base_blob<256U>.m_data._M_elems[3];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[4] =
         local_e8.super_base_blob<256U>.m_data._M_elems[4];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[5] =
         local_e8.super_base_blob<256U>.m_data._M_elems[5];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[6] =
         local_e8.super_base_blob<256U>.m_data._M_elems[6];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[7] =
         local_e8.super_base_blob<256U>.m_data._M_elems[7];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[8] =
         local_e8.super_base_blob<256U>.m_data._M_elems[8];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[9] =
         local_e8.super_base_blob<256U>.m_data._M_elems[9];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[10] =
         local_e8.super_base_blob<256U>.m_data._M_elems[10];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xb];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xc];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xd];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xe];
    local_c8.second.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xf];
    bVar3 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                      (this,&local_90,&local_c8,false);
    std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_c8);
    std::__cxx11::string::~string((string *)&local_90);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteKey(const CPubKey& vchPubKey, const CPrivKey& vchPrivKey, const CKeyMetadata& keyMeta)
{
    if (!WriteKeyMetadata(keyMeta, vchPubKey, false)) {
        return false;
    }

    // hash pubkey/privkey to accelerate wallet load
    std::vector<unsigned char> vchKey;
    vchKey.reserve(vchPubKey.size() + vchPrivKey.size());
    vchKey.insert(vchKey.end(), vchPubKey.begin(), vchPubKey.end());
    vchKey.insert(vchKey.end(), vchPrivKey.begin(), vchPrivKey.end());

    return WriteIC(std::make_pair(DBKeys::KEY, vchPubKey), std::make_pair(vchPrivKey, Hash(vchKey)), false);
}